

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaNormalTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements
          (cmNinjaNormalTargetGenerator *this,string *config,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *architectures,string *output)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  cmGlobalNinjaGenerator *this_00;
  string *psVar4;
  reference pbVar5;
  cmGeneratedFileStream *pcVar6;
  mapped_type *pmVar7;
  cmGeneratorTarget *target;
  string *local_9d8;
  string *local_9c0;
  string *local_990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_8f8;
  allocator<char> local_8c1;
  key_type local_8c0;
  undefined1 local_8a0 [8];
  string linkLibs;
  string linkPath;
  string frameworkPath;
  cmStateDirectory local_828;
  undefined1 local_800 [8];
  cmNinjaLinkLineDeviceComputer linkLineComputer;
  key_type local_7b0;
  string local_790;
  string_view local_770;
  string local_760;
  allocator<char> local_739;
  key_type local_738;
  string local_718;
  string_view local_6f8;
  string local_6e8;
  string *local_6c8;
  string local_6c0;
  iterator local_6a0;
  size_type local_698;
  undefined1 local_690 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_688;
  iterator local_668;
  undefined8 local_660;
  string local_658;
  undefined1 local_638 [8];
  cmNinjaBuild dcompile;
  cmLocalNinjaGenerator *localGen;
  string local_508;
  iterator local_4e8;
  size_type local_4e0;
  allocator<char> local_4d1;
  key_type local_4d0;
  string local_4b0;
  allocator<char> local_489;
  key_type local_488;
  string local_468;
  allocator<char> local_441;
  key_type local_440;
  string local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3f8;
  iterator local_3d8;
  size_type local_3d0;
  string local_3c8;
  undefined1 local_3a8 [8];
  cmNinjaBuild dlink;
  string cubin;
  string architecture;
  string *architectureKind;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_208 [8];
  cmNinjaBuild fatbinary;
  string ninjaOutputDir;
  string local_a8;
  undefined1 local_88 [8];
  string objectDir;
  cmGlobalNinjaGenerator *globalGen;
  string *local_48;
  undefined1 local_40 [8];
  cmNinjaDeps explicitDeps;
  string *output_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *architectures_local;
  string *config_local;
  cmNinjaNormalTargetGenerator *this_local;
  
  globalGen = (cmGlobalNinjaGenerator *)this;
  local_48 = config;
  explicitDeps.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = output;
  WriteDeviceLinkStatements(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string_const&)
  ::$_0::operator()[abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,&globalGen);
  this_00 = cmNinjaTargetGenerator::GetGlobalGenerator(&this->super_cmNinjaTargetGenerator);
  cmGeneratorTarget::GetSupportDirectory_abi_cxx11_
            (&local_a8,
             (this->super_cmNinjaTargetGenerator).super_cmCommonTargetGenerator.GeneratorTarget);
  (*(this_00->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[0x4d])
            ((undefined1 *)((long)&ninjaOutputDir.field_2 + 8),this_00,config);
  cmStrCat<std::__cxx11::string,std::__cxx11::string>
            ((string *)local_88,&local_a8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&ninjaOutputDir.field_2 + 8));
  std::__cxx11::string::~string((string *)(ninjaOutputDir.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_a8);
  psVar4 = cmNinjaTargetGenerator::ConvertToNinjaPath
                     (&this->super_cmNinjaTargetGenerator,(string *)local_88);
  std::__cxx11::string::string
            ((string *)(fatbinary.RspFile.field_2._M_local_buf + 8),(string *)psVar4);
  LanguageLinkerCudaFatbinaryRule((string *)&__range1,this,config);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_208,(string *)&__range1);
  std::__cxx11::string::~string((string *)&__range1);
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(architectures);
  architectureKind =
       (string *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(architectures);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&architectureKind), bVar2) {
    pbVar5 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::string::find((char)pbVar5,0x2d);
    std::__cxx11::string::substr((ulong)((long)&cubin.field_2 + 8),(ulong)pbVar5);
    cmStrCat<std::__cxx11::string_const&,char_const(&)[5],std::__cxx11::string_const&,char_const(&)[7]>
              ((string *)((long)&dlink.RspFile.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&fatbinary.RspFile.field_2 + 8),(char (*) [5])"/sm_",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&cubin.field_2 + 8),(char (*) [7])".cubin");
    LanguageLinkerCudaDeviceRule(&local_3c8,this,config);
    cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_3a8,&local_3c8);
    std::__cxx11::string::~string((string *)&local_3c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&dlink.WorkDirOuts.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
    local_400 = &local_3f8;
    std::__cxx11::string::string
              ((string *)local_400,(string *)(dlink.RspFile.field_2._M_local_buf + 8));
    local_3d8 = &local_3f8;
    local_3d0 = 1;
    __l_02._M_len = 1;
    __l_02._M_array = local_3d8;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&dlink.Rule.field_2 + 8),__l_02);
    local_8f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_3d8;
    do {
      local_8f8 = local_8f8 + -1;
      std::__cxx11::string::~string((string *)local_8f8);
    } while (local_8f8 != &local_3f8);
    cmStrCat<char_const(&)[4],std::__cxx11::string_const&>
              (&local_420,(char (*) [4])0x126a0fa,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&cubin.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"ARCH",&local_441);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&dlink.OrderOnlyDeps.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_440);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    std::__cxx11::string::~string((string *)&local_420);
    bVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&fatbinary.WorkDirOuts.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar2) {
      cmStrCat<char_const(&)[26],std::__cxx11::string_const&,char_const(&)[23]>
                (&local_468,(char (*) [26])0x128981a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&fatbinary.RspFile.field_2 + 8),(char (*) [23])"/cmake_cuda_register.h");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"REGISTER",&local_489)
      ;
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&dlink.OrderOnlyDeps.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_488);
      std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_468);
      std::__cxx11::string::~string((string *)&local_488);
      std::allocator<char>::~allocator(&local_489);
      std::__cxx11::string::~string((string *)&local_468);
    }
    cmStrCat<char_const(&)[17],std::__cxx11::string_const&,char_const(&)[7],std::__cxx11::string_const&>
              (&local_4b0,(char (*) [17])" -im=profile=sm_",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&cubin.field_2 + 8),(char (*) [7])",file=",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&dlink.RspFile.field_2 + 8));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4d0,"PROFILES",&local_4d1);
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&fatbinary.OrderOnlyDeps.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_4d0);
    std::__cxx11::string::operator+=((string *)pmVar7,(string *)&local_4b0);
    std::__cxx11::string::~string((string *)&local_4d0);
    std::allocator<char>::~allocator(&local_4d1);
    std::__cxx11::string::~string((string *)&local_4b0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &fatbinary.WorkDirOuts.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&dlink.RspFile.field_2 + 8));
    pcVar6 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
    cmGlobalNinjaGenerator::WriteBuild
              (this_00,(ostream *)pcVar6,(cmNinjaBuild *)local_3a8,0,(bool *)0x0);
    cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_3a8);
    std::__cxx11::string::~string((string *)(dlink.RspFile.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(cubin.field_2._M_local_buf + 8));
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
            (&local_508,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&fatbinary.RspFile.field_2 + 8),(char (*) [21])"/cmake_cuda_fatbin.h");
  local_4e8 = &local_508;
  local_4e0 = 1;
  __l_01._M_len = 1;
  __l_01._M_array = local_4e8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&fatbinary.Rule.field_2 + 8),__l_01);
  local_990 = (string *)&local_4e8;
  do {
    local_990 = local_990 + -1;
    std::__cxx11::string::~string((string *)local_990);
  } while (local_990 != &local_508);
  pcVar6 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (this_00,(ostream *)pcVar6,(cmNinjaBuild *)local_208,0,(bool *)0x0);
  dcompile.RspFile.field_2._8_8_ =
       cmNinjaTargetGenerator::GetLocalGenerator(&this->super_cmNinjaTargetGenerator);
  LanguageLinkerCudaDeviceCompileRule(&local_658,this,config);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_638,&local_658);
  std::__cxx11::string::~string((string *)&local_658);
  local_690 = (undefined1  [8])(local_690 + 8);
  std::__cxx11::string::string
            ((string *)local_690,
             (string *)
             explicitDeps.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_668 = (iterator)(local_690 + 8);
  local_660 = 1;
  __l_00._M_len = 1;
  __l_00._M_array = local_668;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&dcompile.Rule.field_2 + 8),__l_00);
  local_9c0 = (string *)&local_668;
  do {
    local_9c0 = local_9c0 + -0x20;
    std::__cxx11::string::~string(local_9c0);
  } while (local_9c0 != (string *)(local_690 + 8));
  local_6c8 = &local_6c0;
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
            (local_6c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&fatbinary.RspFile.field_2 + 8),(char (*) [21])"/cmake_cuda_fatbin.h");
  local_6a0 = &local_6c0;
  local_698 = 1;
  __l._M_len = 1;
  __l._M_array = local_6a0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&dcompile.WorkDirOuts.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,__l);
  local_9d8 = (string *)&local_6a0;
  do {
    local_9d8 = local_9d8 + -1;
    std::__cxx11::string::~string((string *)local_9d8);
    uVar1 = dcompile.RspFile.field_2._8_8_;
  } while (local_9d8 != &local_6c0);
  cmStrCat<std::__cxx11::string_const&,char_const(&)[21]>
            (&local_718,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             (char (*) [21])"/cmake_cuda_fatbin.h");
  local_6f8 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_718);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_6e8,(cmOutputConverter *)uVar1,local_6f8,SHELL,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_738,"FATBIN",&local_739);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&dcompile.OrderOnlyDeps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_738);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_738);
  std::allocator<char>::~allocator(&local_739);
  std::__cxx11::string::~string((string *)&local_6e8);
  std::__cxx11::string::~string((string *)&local_718);
  uVar1 = dcompile.RspFile.field_2._8_8_;
  cmStrCat<std::__cxx11::string_const&,char_const(&)[23]>
            (&local_790,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
             (char (*) [23])"/cmake_cuda_register.h");
  local_770 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_790);
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_760,(cmOutputConverter *)uVar1,local_770,SHELL,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_7b0,"REGISTER",(allocator<char> *)((long)&linkLineComputer.GG + 7));
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&dcompile.OrderOnlyDeps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_7b0);
  std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_760);
  std::__cxx11::string::~string((string *)&local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&linkLineComputer.GG + 7));
  std::__cxx11::string::~string((string *)&local_760);
  std::__cxx11::string::~string((string *)&local_790);
  uVar1 = dcompile.RspFile.field_2._8_8_;
  cmLocalGenerator::GetStateSnapshot
            ((cmStateSnapshot *)((long)&frameworkPath.field_2 + 8),
             (cmLocalGenerator *)dcompile.RspFile.field_2._8_8_);
  cmStateSnapshot::GetDirectory(&local_828,(cmStateSnapshot *)((long)&frameworkPath.field_2 + 8));
  cmNinjaLinkLineDeviceComputer::cmNinjaLinkLineDeviceComputer
            ((cmNinjaLinkLineDeviceComputer *)local_800,(cmOutputConverter *)uVar1,&local_828,
             this_00);
  iVar3 = (*(this_00->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator
            [0x28])();
  cmLinkLineComputer::SetUseNinjaMulti((cmLinkLineComputer *)local_800,(bool)((byte)iVar3 & 1));
  std::__cxx11::string::string((string *)(linkPath.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(linkLibs.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_8a0);
  uVar1 = dcompile.RspFile.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"LINK_FLAGS",&local_8c1);
  pmVar7 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&dcompile.OrderOnlyDeps.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_8c0);
  target = cmNinjaTargetGenerator::GetGeneratorTarget(&this->super_cmNinjaTargetGenerator);
  cmLocalGenerator::GetDeviceLinkFlags
            ((cmLocalGenerator *)uVar1,(cmLinkLineDeviceComputer *)local_800,config,
             (string *)local_8a0,pmVar7,(string *)((long)&linkPath.field_2 + 8),
             (string *)((long)&linkLibs.field_2 + 8),target);
  std::__cxx11::string::~string((string *)&local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  pcVar6 = cmNinjaTargetGenerator::GetCommonFileStream(&this->super_cmNinjaTargetGenerator);
  cmGlobalNinjaGenerator::WriteBuild
            (this_00,(ostream *)pcVar6,(cmNinjaBuild *)local_638,0,(bool *)0x0);
  std::__cxx11::string::~string((string *)local_8a0);
  std::__cxx11::string::~string((string *)(linkLibs.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(linkPath.field_2._M_local_buf + 8));
  cmNinjaLinkLineDeviceComputer::~cmNinjaLinkLineDeviceComputer
            ((cmNinjaLinkLineDeviceComputer *)local_800);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_638);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_208);
  std::__cxx11::string::~string((string *)(fatbinary.RspFile.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  return;
}

Assistant:

void cmNinjaNormalTargetGenerator::WriteDeviceLinkStatements(
  const std::string& config, const std::vector<std::string>& architectures,
  const std::string& output)
{
  // Ensure there are no duplicates.
  const cmNinjaDeps explicitDeps = [&]() -> std::vector<std::string> {
    std::unordered_set<std::string> depsSet;
    const cmNinjaDeps linkDeps =
      this->ComputeLinkDeps(this->TargetLinkLanguage(config), config, true);
    const cmNinjaDeps objects = this->GetObjects(config);
    depsSet.insert(linkDeps.begin(), linkDeps.end());
    depsSet.insert(objects.begin(), objects.end());

    std::vector<std::string> deps;
    std::copy(depsSet.begin(), depsSet.end(), std::back_inserter(deps));
    return deps;
  }();

  cmGlobalNinjaGenerator* globalGen{ this->GetGlobalGenerator() };
  const std::string objectDir =
    cmStrCat(this->GeneratorTarget->GetSupportDirectory(),
             globalGen->ConfigDirectory(config));
  const std::string ninjaOutputDir = this->ConvertToNinjaPath(objectDir);

  cmNinjaBuild fatbinary(this->LanguageLinkerCudaFatbinaryRule(config));

  // Link device code for each architecture.
  for (const std::string& architectureKind : architectures) {
    // Clang always generates real code, so strip the specifier.
    const std::string architecture =
      architectureKind.substr(0, architectureKind.find('-'));
    const std::string cubin =
      cmStrCat(ninjaOutputDir, "/sm_", architecture, ".cubin");

    cmNinjaBuild dlink(this->LanguageLinkerCudaDeviceRule(config));
    dlink.ExplicitDeps = explicitDeps;
    dlink.Outputs = { cubin };
    dlink.Variables["ARCH"] = cmStrCat("sm_", architecture);

    // The generated register file contains macros that when expanded register
    // the device routines. Because the routines are the same for all
    // architectures the register file will be the same too. Thus generate it
    // only on the first invocation to reduce overhead.
    if (fatbinary.ExplicitDeps.empty()) {
      dlink.Variables["REGISTER"] = cmStrCat(
        "--register-link-binaries=", ninjaOutputDir, "/cmake_cuda_register.h");
    }

    fatbinary.Variables["PROFILES"] +=
      cmStrCat(" -im=profile=sm_", architecture, ",file=", cubin);
    fatbinary.ExplicitDeps.emplace_back(cubin);

    globalGen->WriteBuild(this->GetCommonFileStream(), dlink);
  }

  // Combine all architectures into a single fatbinary.
  fatbinary.Outputs = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  globalGen->WriteBuild(this->GetCommonFileStream(), fatbinary);

  // Compile the stub that registers the kernels and contains the fatbinaries.
  cmLocalNinjaGenerator* localGen{ this->GetLocalGenerator() };
  cmNinjaBuild dcompile(this->LanguageLinkerCudaDeviceCompileRule(config));
  dcompile.Outputs = { output };
  dcompile.ExplicitDeps = { cmStrCat(ninjaOutputDir, "/cmake_cuda_fatbin.h") };
  dcompile.Variables["FATBIN"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_fatbin.h"), cmOutputConverter::SHELL);
  dcompile.Variables["REGISTER"] = localGen->ConvertToOutputFormat(
    cmStrCat(objectDir, "/cmake_cuda_register.h"), cmOutputConverter::SHELL);

  cmNinjaLinkLineDeviceComputer linkLineComputer(
    localGen, localGen->GetStateSnapshot().GetDirectory(), globalGen);
  linkLineComputer.SetUseNinjaMulti(globalGen->IsMultiConfig());

  // Link libraries and paths are only used during the final executable/library
  // link.
  std::string frameworkPath;
  std::string linkPath;
  std::string linkLibs;
  localGen->GetDeviceLinkFlags(linkLineComputer, config, linkLibs,
                               dcompile.Variables["LINK_FLAGS"], frameworkPath,
                               linkPath, this->GetGeneratorTarget());

  globalGen->WriteBuild(this->GetCommonFileStream(), dcompile);
}